

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::ImulExtendedCase::compare
          (ImulExtendedCase *this,void **inputs,void **outputs)

{
  DataType dataType;
  int iVar1;
  reference pvVar2;
  long lVar3;
  ostream *poVar4;
  Hex<8UL> HVar5;
  deInt32 ref1;
  deInt32 ref0;
  deInt64 mul64;
  deInt32 out1;
  deInt32 out0;
  deInt32 in1;
  deInt32 in0;
  int compNdx;
  int scalarSize;
  DataType type;
  void **outputs_local;
  void **inputs_local;
  ImulExtendedCase *this_local;
  
  pvVar2 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](&(this->super_IntegerFunctionCase).m_spec.inputs,0);
  dataType = glu::VarType::getBasicType(&pvVar2->varType);
  iVar1 = glu::getDataTypeScalarSize(dataType);
  in1 = 0;
  while( true ) {
    if (iVar1 <= in1) {
      return true;
    }
    lVar3 = (long)*(int *)((long)*inputs + (long)in1 * 4) *
            (long)*(int *)((long)inputs[1] + (long)in1 * 4);
    if (lVar3 != CONCAT44(*(undefined4 *)((long)*outputs + (long)in1 * 4),
                          *(undefined4 *)((long)outputs[1] + (long)in1 * 4))) break;
    in1 = in1 + 1;
  }
  poVar4 = std::operator<<(&(this->super_IntegerFunctionCase).m_failMsg.
                            super_basic_ostream<char,_std::char_traits<char>_>,"Expected [");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,in1);
  poVar4 = std::operator<<(poVar4,"] = ");
  HVar5 = tcu::toHex<int>((int)((ulong)lVar3 >> 0x20));
  poVar4 = tcu::Format::operator<<(poVar4,HVar5);
  poVar4 = std::operator<<(poVar4,", ");
  HVar5 = tcu::toHex<int>((int)lVar3);
  tcu::Format::operator<<(poVar4,HVar5);
  return false;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deInt32	in0		= ((const deInt32*)inputs[0])[compNdx];
			const deInt32	in1		= ((const deInt32*)inputs[1])[compNdx];
			const deInt32	out0	= ((const deInt32*)outputs[0])[compNdx];
			const deInt32	out1	= ((const deInt32*)outputs[1])[compNdx];
			const deInt64	mul64	= deInt64(in0)*deInt64(in1);
			const deInt32	ref0	= deInt32(mul64 >> 32);
			const deInt32	ref1	= deInt32(mul64 & 0xffffffffu);

			if (out0 != ref0 || out1 != ref1)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(ref0) << ", " << tcu::toHex(ref1);
				return false;
			}
		}

		return true;
	}